

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_b_cdf(double x,double mu,double s,double b)

{
  double dVar1;
  double dVar2;
  double xi_cdf;
  double xi;
  double cdf;
  double beta_cdf;
  double beta;
  double b_local;
  double s_local;
  double mu_local;
  double x_local;
  
  dVar1 = normal_01_cdf((b - mu) / s);
  dVar2 = normal_01_cdf((x - mu) / s);
  return dVar2 / dVar1;
}

Assistant:

double normal_truncated_b_cdf ( double x, double mu, double s, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_B_CDF evaluates the upper truncated Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double B, the upper truncation limit.
//
//    Output, double NORMAL_TRUNCATED_B_CDF, the value of the CDF.
//
{
  double beta;
  double beta_cdf;
  double cdf;
  double xi;
  double xi_cdf;

  beta = ( b - mu ) / s;
  xi = ( x - mu ) / s;

  beta_cdf = normal_01_cdf ( beta );
  xi_cdf = normal_01_cdf ( xi );

  cdf = xi_cdf / beta_cdf;

  return cdf;
}